

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O1

void __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
::loose_insert(BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
               *this,Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>
                     *entry)

{
  Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
  *data;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  int index;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>
  *pPVar5;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
  **ppBVar6;
  size_t index_00;
  
  pPVar5 = find(this,entry);
  if (pPVar5 == (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>
                 *)0x0) {
    data = &this->data;
    index = b_array::first_ge<Map::Pair<std::__cxx11::string,Table>>(data,this->data_size,entry);
    index_00 = (size_t)index;
    if (this->subset_size != 0) {
      pPVar5 = b_array::
               Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
               ::operator[](data,index_00);
      bVar4 = Map::operator!=(pPVar5,entry);
      if (bVar4) {
        ppBVar6 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
                  ::operator[](&this->subset,index_00);
        loose_insert(*ppBVar6,entry);
        ppBVar6 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
                  ::operator[](&this->subset,index_00);
        if ((*ppBVar6)->data_size < 3) {
          return;
        }
        fix_excess(this,index);
        return;
      }
    }
    pPVar5 = b_array::
             Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
             ::operator[](data,index_00);
    bVar4 = Map::operator!=(pPVar5,entry);
    if (bVar4) {
      b_array::insert_item<Map::Pair<std::__cxx11::string,Table>>
                (data,index_00,&this->data_size,entry);
      return;
    }
  }
  else if (this->duplicates_allowed == false) {
    std::__cxx11::string::_M_assign((string *)pPVar5);
    std::__cxx11::string::_M_assign((string *)&pPVar5->value);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(pPVar5->value).columns,&(entry->value).columns);
    BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::operator=(&(pPVar5->value).column_map.tree,&(entry->value).column_map.tree);
    BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator=((BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)&(pPVar5->value).index,
                (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)&(entry->value).index);
    pcVar1 = (entry->value).MAX_FIELD_EXCEEDED;
    pcVar2 = (entry->value).MAX_FIELD_SIZE_EXCEEDED;
    pcVar3 = (entry->value).MISMATCHED_COL_NUM;
    (pPVar5->value).CANNOT_FIND_TABLE = (entry->value).CANNOT_FIND_TABLE;
    (pPVar5->value).MAX_FIELD_EXCEEDED = pcVar1;
    (pPVar5->value).MAX_FIELD_SIZE_EXCEEDED = pcVar2;
    (pPVar5->value).MISMATCHED_COL_NUM = pcVar3;
    (pPVar5->value).INVALID_NAME = (entry->value).INVALID_NAME;
  }
  return;
}

Assistant:

void BPlusTree<T>::loose_insert(const T& entry) {
    // check if thing is already here
    T* item = find(entry);
    // assuming the duplicates allowed flag is for multimap to call +=
    if (item != nullptr) {
        if (!duplicates_allowed)
            *item = entry;
        else
            *item += entry;
        return;
    }
    
    // it's not here, put it somewhere
    int index = b_array::first_ge(data, data_size, entry);
    if (!is_leaf() && data[index] != entry)
        subset[index]->loose_insert(entry);
    else {
        if (data[index] != entry)
            b_array::insert_item(data, index, data_size, entry);
        return;
    }
    if (subset[index]->data_size > MAXIMUM) {
        fix_excess(index);
    }
}